

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O3

int json_enum_option(lua_State *l,int optindex,int *setting,char **options,int bool_true)

{
  int iVar1;
  uint b;
  int extraout_EAX;
  char *pcVar2;
  undefined4 in_register_00000034;
  char **lst;
  
  lst = json_enum_option::bool_options;
  if (setting != (int *)0x0) {
    lst = (char **)setting;
  }
  iVar1 = lua_type(l,1);
  if (iVar1 == 0) {
    b = *(uint *)CONCAT44(in_register_00000034,optindex);
  }
  else {
    iVar1 = lua_type(l,1);
    if (iVar1 == 1) {
      b = lua_toboolean(l,1);
    }
    else {
      b = luaL_checkoption(l,1,(char *)0x0,lst);
    }
    *(uint *)CONCAT44(in_register_00000034,optindex) = b;
  }
  if (b < 2) {
    lua_pushboolean(l,b);
    return extraout_EAX;
  }
  pcVar2 = lua_pushstring(l,lst[(int)b]);
  return (int)pcVar2;
}

Assistant:

static int json_enum_option(lua_State *l, int optindex, int *setting,
                            const char **options, int bool_true)
{
    static const char *bool_options[] = { "off", "on", NULL };

    if (!options) {
        options = bool_options;
        bool_true = 1;
    }

    if (!lua_isnil(l, optindex)) {
        if (bool_true && lua_isboolean(l, optindex))
            *setting = lua_toboolean(l, optindex) * bool_true;
        else
            *setting = luaL_checkoption(l, optindex, NULL, options);
    }

    if (bool_true && (*setting == 0 || *setting == bool_true))
        lua_pushboolean(l, *setting);
    else
        lua_pushstring(l, options[*setting]);

    return 1;
}